

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiPopupRef *pIVar4;
  long in_RDI;
  int m;
  bool popup_or_descendent_has_focus;
  ImGuiPopupRef *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  int local_28;
  ImGuiPopupRef *in_stack_ffffffffffffffe0;
  int local_14;
  
  pIVar2 = GImGui;
  bVar3 = ImVector<ImGuiPopupRef>::empty(&GImGui->OpenPopupStack);
  if (!bVar3) {
    local_14 = 0;
    if (in_RDI != 0) {
      for (; local_14 < (pIVar2->OpenPopupStack).Size; local_14 = local_14 + 1) {
        in_stack_ffffffffffffffe0 =
             ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_14);
        if ((in_stack_ffffffffffffffe0->Window != (ImGuiWindow *)0x0) &&
           ((in_stack_ffffffffffffffe0->Window->Flags & 0x1000000U) == 0)) {
          bVar3 = false;
          local_28 = local_14;
          while( true ) {
            bVar1 = false;
            if (local_28 < (pIVar2->OpenPopupStack).Size) {
              bVar1 = (bool)(bVar3 ^ 1);
            }
            if (!bVar1) break;
            pIVar4 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_28);
            if ((pIVar4->Window != (ImGuiWindow *)0x0) &&
               (pIVar4 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_28),
               pIVar4->Window->RootWindow == *(ImGuiWindow **)(in_RDI + 0x360))) {
              bVar3 = true;
            }
            local_28 = local_28 + 1;
          }
          if (!bVar3) break;
        }
      }
    }
    if (local_14 < (pIVar2->OpenPopupStack).Size) {
      ClosePopupToLevel((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                        SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.empty())
        return;

    // When popups are stacked, clicking on a lower level popups puts focus back to it and close popups above it.
    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupRef& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack if popups are not direct descendant of the reference window (which is often the NavWindow)
            bool popup_or_descendent_has_focus = false;
            for (int m = popup_count_to_keep; m < g.OpenPopupStack.Size && !popup_or_descendent_has_focus; m++)
                if (g.OpenPopupStack[m].Window && g.OpenPopupStack[m].Window->RootWindow == ref_window->RootWindow)
                    popup_or_descendent_has_focus = true;
            if (!popup_or_descendent_has_focus)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        //IMGUI_DEBUG_LOG("ClosePopupsOverWindow(%s) -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, false);
    }
}